

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImPool<ImPlotItem>::Clear(ImPool<ImPlotItem> *this)

{
  uint uVar1;
  ImGuiStoragePair *ptr;
  ImPlotItem *pIVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(this->Map).Data.Size;
  ptr = (this->Map).Data.Data;
  if (lVar3 < 1) {
    if (ptr == (ImGuiStoragePair *)0x0) goto LAB_001bdb6b;
  }
  else {
    pIVar2 = (this->Buf).Data;
    lVar4 = 0;
    do {
      uVar1 = *(uint *)((long)&ptr->field_1 + lVar4);
      if ((ulong)uVar1 != 0xffffffff) {
        if (((int)uVar1 < 0) || ((this->Buf).Size <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                        ,0x68b,"T &ImVector<ImPlotItem>::operator[](int) [T = ImPlotItem]");
        }
        pIVar2[uVar1].ID = 0;
      }
      lVar4 = lVar4 + 0x10;
    } while (lVar3 * 0x10 != lVar4);
  }
  (this->Map).Data.Size = 0;
  (this->Map).Data.Capacity = 0;
  ImGui::MemFree(ptr);
  (this->Map).Data.Data = (ImGuiStoragePair *)0x0;
LAB_001bdb6b:
  pIVar2 = (this->Buf).Data;
  if (pIVar2 != (ImPlotItem *)0x0) {
    (this->Buf).Size = 0;
    (this->Buf).Capacity = 0;
    ImGui::MemFree(pIVar2);
    (this->Buf).Data = (ImPlotItem *)0x0;
  }
  this->FreeIdx = 0;
  this->AliveCount = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Buf[idx].~T(); } Map.Clear(); Buf.clear(); FreeIdx = AliveCount = 0; }